

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void jit_rec_ADD_LL(Trace *trace,BcIns bc)

{
  uint8_t uVar1;
  byte bVar2;
  IrRef IVar3;
  IrRef arg2;
  IrIns ins;
  IrRef result;
  IrRef right;
  IrRef left;
  BcIns bc_local;
  Trace *trace_local;
  
  uVar1 = bc_arg2(bc);
  IVar3 = ir_load_stack(trace,uVar1);
  uVar1 = bc_arg3(bc);
  arg2 = ir_load_stack(trace,uVar1);
  ins = ir_new2(IR_ADD,IVar3,arg2);
  IVar3 = ir_emit(trace,ins);
  bVar2 = bc_arg1(bc);
  trace->last_modified[bVar2] = IVar3;
  return;
}

Assistant:

void jit_rec_ADD_LL(Trace *trace, BcIns bc) {
	// Load the arguments to the add instruction
	IrRef left = ir_load_stack(trace, bc_arg2(bc));
	IrRef right = ir_load_stack(trace, bc_arg3(bc));

	// Emit an add instruction
	IrRef result = ir_emit(trace, ir_new2(IR_ADD, left, right));

	// Keep track of the last instruction that modified the destination slot
	trace->last_modified[bc_arg1(bc)] = result;

	// All the remaining arithmetic instructions are exactly like this...
}